

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void __thiscall
charls::process_transformed<charls::transform_hp2<unsigned_short>_>::encode_transform
          (process_transformed<charls::transform_hp2<unsigned_short>_> *this,void *source,
          void *destination,size_t pixel_count,size_t destination_stride)

{
  unsigned_short *puVar1;
  size_t destination_stride_local;
  size_t pixel_count_local;
  void *destination_local;
  void *source_local;
  process_transformed<charls::transform_hp2<unsigned_short>_> *this_local;
  
  destination_local = source;
  if ((this->parameters_->output_bgr & 1U) != 0) {
    puVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data(&this->temp_line_);
    memcpy(puVar1,source,pixel_count * 6);
    puVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data(&this->temp_line_);
    transform_rgb_to_bgr<unsigned_short>
              (puVar1,(long)this->frame_info_->component_count,pixel_count);
    destination_local =
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data(&this->temp_line_);
  }
  if (this->frame_info_->component_count == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      transform_line<charls::transform_hp2<unsigned_short>,unsigned_short>
                ((triplet<unsigned_short> *)destination,(triplet<unsigned_short> *)destination_local
                 ,pixel_count,(transform_hp2<unsigned_short> *)&this->field_0x50,this->mask_);
    }
    else {
      transform_triplet_to_line<charls::transform_hp2<unsigned_short>,unsigned_short>
                ((triplet<unsigned_short> *)destination_local,pixel_count,
                 (unsigned_short *)destination,destination_stride,
                 (transform_hp2<unsigned_short> *)&this->field_0x50,this->mask_);
    }
  }
  else if (this->frame_info_->component_count == 4) {
    if (this->parameters_->interleave_mode == Sample) {
      transform_line<charls::transform_hp2<unsigned_short>,unsigned_short>
                ((quad<unsigned_short> *)destination,(quad<unsigned_short> *)destination_local,
                 pixel_count,(transform_hp2<unsigned_short> *)&this->field_0x50,this->mask_);
    }
    else if (this->parameters_->interleave_mode == Line) {
      transform_quad_to_line<charls::transform_hp2<unsigned_short>,unsigned_short>
                ((quad<unsigned_short> *)destination_local,pixel_count,(unsigned_short *)destination
                 ,destination_stride,(transform_hp2<unsigned_short> *)&this->field_0x50,this->mask_)
      ;
    }
  }
  return;
}

Assistant:

void encode_transform(const void* source, void* destination, const size_t pixel_count,
                          const size_t destination_stride) noexcept
    {
        if (parameters_.output_bgr)
        {
            memcpy(temp_line_.data(), source, sizeof(triplet<size_type>) * pixel_count);
            transform_rgb_to_bgr(temp_line_.data(), frame_info_.component_count, pixel_count);
            source = temp_line_.data();
        }

        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else
            {
                transform_triplet_to_line(static_cast<const triplet<size_type>*>(source), pixel_count,
                                          static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_quad_to_line(static_cast<const quad<size_type>*>(source), pixel_count,
                                       static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
    }